

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::anon_unknown_0::TransferTestInstance::~TransferTestInstance
          (TransferTestInstance *this)

{
  Allocation *pAVar1;
  VkImage VVar2;
  VkBuffer VVar3;
  
  (this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__TransferTestInstance_00cf17c8;
  pAVar1 = (this->m_msImageAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (pAVar1 != (Allocation *)0x0) {
    (*pAVar1->_vptr_Allocation[1])();
    (this->m_msImageAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  pAVar1 = (this->m_depthImageAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (pAVar1 != (Allocation *)0x0) {
    (*pAVar1->_vptr_Allocation[1])();
    (this->m_depthImageAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  pAVar1 = (this->m_dstImageAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (pAVar1 != (Allocation *)0x0) {
    (*pAVar1->_vptr_Allocation[1])();
    (this->m_dstImageAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  pAVar1 = (this->m_srcImageAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (pAVar1 != (Allocation *)0x0) {
    (*pAVar1->_vptr_Allocation[1])();
    (this->m_srcImageAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  VVar2.m_internal =
       (this->m_msImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  if (VVar2.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&(this->m_msImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,VVar2
              );
  }
  (this->m_msImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_msImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_msImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_msImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  VVar2.m_internal =
       (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  if (VVar2.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&(this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               VVar2);
  }
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  VVar2.m_internal =
       (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  if (VVar2.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&(this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               VVar2);
  }
  (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  VVar2.m_internal =
       (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  if (VVar2.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&(this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               VVar2);
  }
  (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  pAVar1 = (this->m_dstBufferAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (pAVar1 != (Allocation *)0x0) {
    (*pAVar1->_vptr_Allocation[1])();
    (this->m_dstBufferAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  pAVar1 = (this->m_srcBufferAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (pAVar1 != (Allocation *)0x0) {
    (*pAVar1->_vptr_Allocation[1])();
    (this->m_srcBufferAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  VVar3.m_internal =
       (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  if (VVar3.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&(this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               VVar3);
  }
  (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  VVar3.m_internal =
       (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  if (VVar3.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&(this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               VVar3);
  }
  (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  TimestampTestInstance::~TimestampTestInstance(&this->super_TimestampTestInstance);
  return;
}

Assistant:

TransferTestInstance::~TransferTestInstance(void)
{
}